

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O3

int mg_read_inner(mg_connection *conn,void *buf,size_t len)

{
  long lVar1;
  char *__nptr;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  size_t sVar5;
  ulong uVar6;
  size_t __n;
  mg_connection *conn_00;
  int iVar7;
  uint uVar8;
  size_t sVar9;
  ulong uVar10;
  double dVar11;
  timespec tsnow;
  ulong local_68;
  size_t local_58;
  timespec local_50;
  void *local_40;
  long local_38;
  
  lVar1 = conn->consumed_content;
  uVar3 = 0x7fffffffffffffff;
  if ((ulong)conn->content_len < 0x7fffffffffffffff) {
    uVar3 = conn->content_len;
  }
  sVar5 = uVar3 - lVar1;
  __n = 0;
  if (sVar5 == 0 || (long)uVar3 < lVar1) goto LAB_0010e30a;
  sVar9 = 0x7fffffff;
  if (len < 0x7fffffff) {
    sVar9 = len;
  }
  if ((long)sVar5 < (long)sVar9) {
    sVar9 = sVar5;
  }
  __n = (conn->data_len - lVar1) - (long)conn->request_len;
  if ((long)__n < 1) {
    __n = 0;
  }
  else {
    if ((long)sVar9 < (long)__n) {
      __n = sVar9;
    }
    memcpy(buf,conn->buf + lVar1 + conn->request_len,__n);
    sVar9 = sVar9 - __n;
    conn->consumed_content = conn->consumed_content + __n;
    buf = (void *)((long)buf + __n);
  }
  __nptr = conn->dom_ctx->config[0xb];
  if (__nptr == (char *)0x0) {
LAB_0010e1b4:
    dVar11 = strtod("30000",(char **)0x0);
    dVar11 = dVar11 / 1000.0;
  }
  else {
    iVar2 = atoi(__nptr);
    dVar11 = (double)iVar2 / 1000.0;
    if (dVar11 <= 0.0) goto LAB_0010e1b4;
  }
  local_68 = 0;
  clock_gettime(0,&local_50);
  lVar1 = local_50.tv_nsec;
  if ((int)sVar9 < 1) {
    local_58 = 0;
  }
  else {
    local_38 = local_50.tv_sec;
    uVar3 = (ulong)(dVar11 * 1000000000.0);
    uVar6 = (long)uVar3 >> 0x3f;
    uVar10 = (long)(dVar11 * 1000000000.0 - 9.223372036854776e+18) & uVar6;
    local_40 = buf;
    do {
      local_58 = (size_t)(int)(uint)local_68;
      conn_00 = (mg_connection *)((long)local_40 + local_58);
      while( true ) {
        if (conn->phys_ctx->stop_flag != 0) goto LAB_0010e2e5;
        iVar7 = (int)sVar9;
        iVar2 = pull_inner((FILE *)conn,conn_00,(char *)(sVar9 & 0xffffffff),(int)uVar6,dVar11);
        if (iVar2 != -1) break;
        if (dVar11 < 0.0) goto LAB_0010e2e5;
        clock_gettime(0,&local_50);
        uVar6 = local_50.tv_nsec - lVar1;
        if ((uVar10 | uVar3) < (local_50.tv_sec - local_38) * 1000000000 + uVar6) goto LAB_0010e2e5;
      }
      if (iVar2 == 0) goto LAB_0010e2e5;
      if (iVar2 == -2) {
        if ((uint)local_68 != 0) goto LAB_0010e2e5;
        local_58 = 0xffffffffffffffff;
        goto LAB_0010e303;
      }
      uVar4 = (uint)local_68 + iVar2;
      uVar6 = (ulong)uVar4;
      uVar8 = iVar7 - iVar2;
      sVar9 = (size_t)uVar8;
      local_68 = uVar6;
    } while (uVar8 != 0 && iVar2 <= iVar7);
    local_58 = (size_t)(int)uVar4;
    local_68._0_4_ = uVar4;
LAB_0010e2e5:
    if ((int)(uint)local_68 < 0) {
LAB_0010e303:
      if ((long)__n < 1) {
        __n = local_58;
      }
      goto LAB_0010e30a;
    }
  }
  conn->consumed_content = conn->consumed_content + local_58;
  __n = __n + local_58;
LAB_0010e30a:
  return (int)__n;
}

Assistant:

static int
mg_read_inner(struct mg_connection *conn, void *buf, size_t len)
{
	int64_t content_len, n, buffered_len, nread;
	int64_t len64 =
	    (int64_t)((len > INT_MAX) ? INT_MAX : len); /* since the return value is
	                                                 * int, we may not read more
	                                                 * bytes */
	const char *body;

	if (conn == NULL) {
		return 0;
	}

	/* If Content-Length is not set for a response with body data,
	 * we do not know in advance how much data should be read. */
	content_len = conn->content_len;
	if (content_len < 0) {
		/* The body data is completed when the connection is closed. */
		content_len = INT64_MAX;
	}

	nread = 0;
	if (conn->consumed_content < content_len) {
		/* Adjust number of bytes to read. */
		int64_t left_to_read = content_len - conn->consumed_content;
		if (left_to_read < len64) {
			/* Do not read more than the total content length of the
			 * request.
			 */
			len64 = left_to_read;
		}

		/* Return buffered data */
		buffered_len = (int64_t)(conn->data_len) - (int64_t)conn->request_len
		               - conn->consumed_content;
		if (buffered_len > 0) {
			if (len64 < buffered_len) {
				buffered_len = len64;
			}
			body = conn->buf + conn->request_len + conn->consumed_content;
			memcpy(buf, body, (size_t)buffered_len);
			len64 -= buffered_len;
			conn->consumed_content += buffered_len;
			nread += buffered_len;
			buf = (char *)buf + buffered_len;
		}

		/* We have returned all buffered data. Read new data from the remote
		 * socket.
		 */
		if ((n = pull_all(NULL, conn, (char *)buf, (int)len64)) >= 0) {
			conn->consumed_content += n;
			nread += n;
		} else {
			nread = ((nread > 0) ? nread : n);
		}
	}
	return (int)nread;
}